

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall Messages::Person_PhoneNumber::SharedDtor(Person_PhoneNumber *this)

{
  ulong uVar1;
  LogMessage *pLVar2;
  LogFinisher local_49;
  LogMessage local_48 [56];
  
  uVar1 = *(ulong *)&this->field_0x8;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 != 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O2/proto/messages.pb.cc"
               ,0xe1);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_48);
  }
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->number_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

void Person_PhoneNumber::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  number_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}